

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  char_type buffer [13];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_48;
  char local_2d [13];
  
  uVar6 = *(uint *)this;
  iVar1 = *(int *)(this + 4);
  lVar8 = (long)iVar1;
  pcVar3 = local_2d + lVar8;
  uVar5 = uVar6;
  if (99 < uVar6) {
    do {
      uVar5 = uVar6 / 100;
      *(undefined2 *)(pcVar3 + -2) =
           *(undefined2 *)(internal::basic_data<void>::DIGITS + (ulong)(uVar6 % 100) * 2);
      pcVar3 = pcVar3 + -2;
      bVar2 = 9999 < uVar6;
      uVar6 = uVar6 / 100;
    } while (bVar2);
  }
  local_48._M_stream = it->_M_stream;
  local_48._M_string = it->_M_string;
  if (uVar5 < 10) {
    bVar4 = (byte)uVar5 | 0x30;
    lVar7 = -1;
  }
  else {
    pcVar3[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar5 * 2 & 0xffffffff) + 1];
    bVar4 = internal::basic_data<void>::DIGITS[(ulong)uVar5 * 2];
    lVar7 = -2;
  }
  pcVar3[lVar7] = bVar4;
  if (0 < iVar1) {
    pcVar3 = local_2d;
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_48,pcVar3);
      pcVar3 = pcVar3 + 1;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  it->_M_stream = local_48._M_stream;
  it->_M_string = local_48._M_string;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }